

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

Float pbrt::MISWeight(Integrator *integrator,Vertex *lightVertices,Vertex *cameraVertices,
                     Vertex *sampled,int s,int t,LightSamplerHandle *lightSampler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar4;
  undefined1 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uintptr_t uVar13;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar14;
  bool bVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Vertex *pVVar27;
  Float *pFVar28;
  Float *pFVar29;
  Vertex *prev;
  uint *puVar30;
  Vertex *v;
  Vertex *this;
  ulong uVar31;
  long lVar32;
  bool *pbVar33;
  Vertex *this_00;
  byte bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  Float FVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  Float FVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  bool local_396;
  bool local_395;
  undefined2 local_394;
  undefined1 local_392;
  undefined2 local_390;
  undefined1 local_38e;
  float local_38c;
  Float *local_388;
  Float *local_380;
  Vertex *local_378;
  bool *local_368;
  undefined4 local_354;
  undefined5 local_350;
  undefined3 uStack_34b;
  undefined5 uStack_348;
  uintptr_t local_340;
  undefined5 local_338;
  undefined3 uStack_333;
  undefined5 uStack_330;
  Float local_324;
  Float local_320;
  Float local_31c;
  undefined1 local_2f8 [16];
  Float *local_2d8;
  undefined3 local_2b3;
  undefined5 uStack_2b0;
  undefined3 local_2a3;
  undefined5 uStack_2a0;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_268;
  undefined1 local_260 [4];
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined1 local_248 [24];
  undefined1 auStack_230 [40];
  undefined1 auStack_208 [24];
  undefined1 local_148 [4];
  undefined8 local_144;
  undefined8 uStack_13c;
  undefined1 local_130 [24];
  undefined1 auStack_118 [40];
  undefined1 auStack_f0 [24];
  undefined1 auVar36 [16];
  
  if (t + s == 2) {
    auVar41._0_4_ = 1.0;
  }
  else {
    uVar4 = (ulong)(uint)s;
    pVVar27 = (Vertex *)0x0;
    this = lightVertices + (uVar4 - 1);
    if (s < 1) {
      this = pVVar27;
    }
    uVar31 = (ulong)(uint)t;
    this_00 = cameraVertices + (uVar31 - 1);
    if (t < 1) {
      this_00 = pVVar27;
    }
    prev = lightVertices + (uVar4 - 2);
    if (s < 2) {
      prev = pVVar27;
    }
    v = cameraVertices + (uVar31 - 2);
    if (t < 2) {
      v = pVVar27;
    }
    FVar40 = 0.0;
    FVar43 = 0.0;
    local_2f8 = ZEXT816(0);
    local_144 = 0;
    uStack_13c = 0;
    auVar41 = ZEXT464(0) << 0x40;
    local_130 = auVar41._0_24_;
    auStack_118 = auVar41._0_40_;
    auStack_f0 = (undefined1  [24])0x0;
    local_338 = 0;
    uStack_333 = 0;
    uStack_330 = 0;
    if (s == 1) {
      uVar13 = (sampled->bsdf).bxdf.
               super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
               .bits;
      fVar21 = (sampled->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar22 = (sampled->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar45 = *(undefined8 *)&(sampled->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar23 = (sampled->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar24 = (sampled->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar25 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar26 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar46 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_2a0 = (undefined5)
                   ((ulong)*(undefined8 *)
                            ((long)&(sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) >>
                   0x18);
      uVar11 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar15 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y;
      local_2a3 = (undefined3)((uint)uVar15 >> 8);
      uVar9 = *(undefined2 *)&sampled->field_0x151;
      uVar8 = sampled->field_0x153;
      uVar1 = sampled->pdfFwd;
      uVar5 = sampled->pdfRev;
      auVar20._4_4_ = uVar5;
      auVar20._0_4_ = uVar1;
      uVar10 = *(undefined4 *)&sampled->field_0x15c;
      local_25c = 0;
      uStack_254 = 0;
      local_350 = 0;
      uStack_34b = 0;
      uStack_348 = 0;
      local_248 = local_130;
      auStack_230 = auStack_118;
      auStack_208 = auStack_f0;
      if (this == (Vertex *)0x0) {
        local_340 = 0;
        local_2f8._0_8_ = 0;
        local_288 = 0x3f800000;
        uStack_280 = 0;
        uStack_278 = 0x3f800000;
        uStack_270 = 0;
        local_38c = 1.0;
        FVar43 = 0.0;
      }
      else {
        memcpy(local_260,this,0x118);
        local_340 = (this->bsdf).bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits;
        local_288._0_4_ = (this->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x;
        local_288._4_4_ = (this->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_280 = *(undefined8 *)
                      &(this->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_278._0_4_ = (this->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_278._4_4_ = (this->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_270._0_4_ = (this->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
        uStack_270._4_4_ = (this->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
        local_38c = (this->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_348 = (undefined5)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) >>
                     0x18);
        uVar19._0_4_ = (this->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x;
        uVar19._4_4_ = (this->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y;
        local_350 = (undefined5)uVar19;
        uStack_34b = (undefined3)((uint)uVar19._4_4_ >> 8);
        local_392 = this->field_0x153;
        local_394 = *(undefined2 *)&this->field_0x151;
        local_2f8._0_4_ = this->pdfFwd;
        local_2f8._4_4_ = this->pdfRev;
        local_354 = *(undefined4 *)&this->field_0x15c;
        memmove(this,sampled,0x118);
        (this->bsdf).bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits = uVar13;
        (this->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = fVar21;
        (this->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = fVar22;
        *(undefined8 *)&(this->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = uVar45;
        (this->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = fVar23;
        (this->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = fVar24;
        (this->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = fVar25;
        (this->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = fVar26;
        (this->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = fVar46;
        (this->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar11;
        (this->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar15;
        *(ulong *)((long)&(this->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) =
             CONCAT53(uStack_2a0,local_2a3);
        *(undefined2 *)&this->field_0x151 = uVar9;
        this->field_0x153 = uVar8;
        auVar20._8_8_ = 0;
        uVar45 = vmovlps_avx(auVar20);
        this->pdfFwd = (Float)(int)uVar45;
        this->pdfRev = (Float)(int)((ulong)uVar45 >> 0x20);
        *(undefined4 *)&this->field_0x15c = uVar10;
        FVar43 = FVar40;
      }
      local_2f8._8_8_ = 0;
      memcpy(local_148,local_260,0x118);
      local_338 = local_350;
      uStack_333 = uStack_34b;
      uStack_330 = uStack_348;
      local_390 = local_394;
      local_38e = local_392;
      local_378 = this;
    }
    else if (t == 1) {
      uVar13 = (sampled->bsdf).bxdf.
               super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
               .bits;
      uVar45._0_4_ = (sampled->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar45._4_4_ = (sampled->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar19 = *(undefined8 *)&(sampled->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar21 = (sampled->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar22 = (sampled->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar23 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar24 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar46 = (sampled->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_2b0 = (undefined5)
                   ((ulong)*(undefined8 *)
                            ((long)&(sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) >>
                   0x18);
      uVar12 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar16 = (sampled->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y;
      local_2b3 = (undefined3)((uint)uVar16 >> 8);
      uVar9 = *(undefined2 *)&sampled->field_0x151;
      uVar8 = sampled->field_0x153;
      uVar2 = sampled->pdfFwd;
      uVar6 = sampled->pdfRev;
      auVar35._4_4_ = uVar6;
      auVar35._0_4_ = uVar2;
      uVar10 = *(undefined4 *)&sampled->field_0x15c;
      local_25c = 0;
      uStack_254 = 0;
      auVar41 = ZEXT464(0) << 0x20;
      local_248 = auVar41._0_24_;
      auStack_230 = auVar41._0_40_;
      auStack_208 = (undefined1  [24])0x0;
      local_350 = 0;
      uStack_34b = 0;
      uStack_348 = 0;
      if (this_00 == (Vertex *)0x0) {
        local_340 = 0;
        local_2f8 = ZEXT416(0) << 0x20;
        local_288 = 0x3f800000;
        uStack_280 = 0;
        uStack_278 = 0x3f800000;
        uStack_270 = 0;
        local_38c = 1.0;
      }
      else {
        uVar44 = uVar45;
        memcpy(local_260,this_00,0x118);
        local_340 = (this_00->bsdf).bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits;
        local_288._0_4_ = (this_00->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x;
        local_288._4_4_ = (this_00->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_280 = *(undefined8 *)
                      &(this_00->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_278._0_4_ = (this_00->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_278._4_4_ = (this_00->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_270._0_4_ = (this_00->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x;
        uStack_270._4_4_ = (this_00->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y;
        local_38c = (this_00->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z;
        uStack_348 = (undefined5)
                     ((ulong)*(undefined8 *)
                              ((long)&(this_00->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1)
                     >> 0x18);
        uVar14._0_4_ = (this_00->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x;
        uVar14._4_4_ = (this_00->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y;
        local_350 = (undefined5)uVar14;
        uStack_34b = (undefined3)((uint)uVar14._4_4_ >> 8);
        local_392 = this_00->field_0x153;
        local_394 = *(undefined2 *)&this_00->field_0x151;
        uVar3 = this_00->pdfFwd;
        uVar7 = this_00->pdfRev;
        local_2f8._4_4_ = uVar7;
        local_2f8._0_4_ = uVar3;
        local_2f8._8_8_ = 0;
        local_354 = *(undefined4 *)&this_00->field_0x15c;
        memmove(this_00,sampled,0x118);
        (this_00->bsdf).bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits = uVar13;
        (this_00->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
             (float)(undefined4)uVar45;
        (this_00->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar45._4_4_;
        *(undefined8 *)&(this_00->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = uVar19
        ;
        (this_00->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = fVar21;
        (this_00->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = fVar22;
        (this_00->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = fVar23;
        (this_00->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = fVar24;
        (this_00->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = fVar46;
        (this_00->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar12;
        (this_00->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar16;
        *(ulong *)((long)&(this_00->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) =
             CONCAT53(uStack_2b0,local_2b3);
        *(undefined2 *)&this_00->field_0x151 = uVar9;
        this_00->field_0x153 = uVar8;
        auVar35._8_8_ = 0;
        uVar45 = vmovlps_avx(auVar35);
        this_00->pdfFwd = (Float)(int)uVar45;
        this_00->pdfRev = (Float)(int)((ulong)uVar45 >> 0x20);
        *(undefined4 *)&this_00->field_0x15c = uVar10;
        uVar45 = uVar44;
      }
      FVar43 = (Float)uVar45;
      memcpy(local_148,local_260,0x118);
      local_338 = local_350;
      uStack_333 = uStack_34b;
      uStack_330 = uStack_348;
      local_390 = local_394;
      local_38e = local_392;
      local_378 = this_00;
    }
    else {
      local_288 = 0x3f800000;
      uStack_280 = 0;
      uStack_278 = 0x3f800000;
      uStack_270 = 0;
      local_38c = 1.0;
      local_378 = (Vertex *)0x0;
      local_340 = 0;
    }
    if (this_00 == (Vertex *)0x0) {
      pbVar33 = (bool *)0x0;
    }
    else {
      pbVar33 = &this_00->delta;
      local_395 = this_00->delta;
      this_00->delta = false;
    }
    if (this == (Vertex *)0x0) {
      local_368 = (bool *)0x0;
    }
    else {
      local_368 = &this->delta;
      local_396 = this->delta;
      this->delta = false;
    }
    if (this_00 == (Vertex *)0x0) {
      local_2d8 = (Float *)0x0;
    }
    else {
      if (s < 1) {
        local_268.bits =
             (lightSampler->
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             ).bits;
        FVar40 = Vertex::PdfLightOrigin
                           (this_00,&integrator->infiniteLights,v,(LightSamplerHandle *)&local_268);
      }
      else {
        FVar40 = Vertex::PDF(this,integrator,prev,this_00);
      }
      local_2d8 = &this_00->pdfRev;
      FVar43 = *local_2d8;
      *local_2d8 = FVar40;
      local_31c = FVar43;
    }
    if (v == (Vertex *)0x0) {
      local_380 = (Float *)0x0;
    }
    else {
      if (s < 1) {
        FVar40 = Vertex::PdfLight(this_00,integrator,v);
      }
      else {
        FVar40 = Vertex::PDF(this_00,integrator,this,v);
      }
      local_380 = &v->pdfRev;
      FVar43 = *local_380;
      *local_380 = FVar40;
      local_320 = FVar43;
    }
    if (this == (Vertex *)0x0) {
      local_388 = (Float *)0x0;
    }
    else {
      FVar40 = Vertex::PDF(this_00,integrator,v,this);
      local_388 = &this->pdfRev;
      FVar43 = this->pdfRev;
      this->pdfRev = FVar40;
      local_324 = FVar43;
    }
    if (prev == (Vertex *)0x0) {
      pFVar28 = (Float *)0x0;
    }
    else {
      FVar40 = Vertex::PDF(this,integrator,this_00,prev);
      pFVar28 = &prev->pdfRev;
      FVar43 = prev->pdfRev;
      prev->pdfRev = FVar40;
    }
    auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
    if (1 < t) {
      lVar32 = uVar31 + 1;
      pFVar29 = &cameraVertices[uVar31 - 1].pdfFwd;
      fVar46 = 1.0;
      auVar47._8_4_ = 0x3f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar47._12_4_ = 0x3f800000;
      do {
        uVar31 = *(ulong *)pFVar29;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar31;
        uVar18 = vcmpps_avx512vl(auVar49,ZEXT816(0) << 0x40,4);
        auVar35 = vblendmps_avx512vl(auVar47,auVar49);
        bVar17 = (bool)((byte)uVar18 & 1);
        auVar36._0_4_ = (float)((uint)bVar17 * auVar35._0_4_ | (uint)!bVar17 * (int)uVar31);
        bVar17 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar17 * auVar35._4_4_ | (uint)!bVar17 * (int)(uVar31 >> 0x20);
        auVar36._8_4_ = (uint)((byte)(uVar18 >> 2) & 1) * auVar35._8_4_;
        auVar36._12_4_ = (uint)((byte)(uVar18 >> 3) & 1) * auVar35._12_4_;
        auVar41._0_16_ = auVar36;
        auVar35 = vmovshdup_avx(auVar36);
        fVar46 = fVar46 * (auVar35._0_4_ / auVar36._0_4_);
        if (*(bool *)(pFVar29 + -1) == false) {
          auVar41._0_4_ = auVar42._0_4_ + fVar46;
          auVar38._16_48_ = auVar41._16_48_;
          auVar38._0_16_ = ZEXT416((uint)auVar41._0_4_);
          auVar41._4_60_ = auVar38._4_60_;
          auVar41._0_4_ =
               (float)((uint)(*(byte *)(pFVar29 + -0x59) & 1) * (int)auVar42._0_4_ +
                      (uint)!(bool)(*(byte *)(pFVar29 + -0x59) & 1) * (int)auVar41._0_4_);
          auVar42 = ZEXT1664(auVar41._0_16_);
        }
        lVar32 = lVar32 + -1;
        pFVar29 = pFVar29 + -0x58;
      } while (2 < lVar32);
    }
    if (s < 1) {
      auVar41._0_4_ = auVar42._0_4_;
    }
    else {
      lVar32 = uVar4 + 1;
      pFVar29 = &lightVertices[uVar4 - 1].pdfFwd;
      fVar46 = 1.0;
      auVar48._8_4_ = 0x3f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      auVar48._12_4_ = 0x3f800000;
      do {
        if (lVar32 == 2) {
          if ((lightVertices->type == Light) &&
             (puVar30 = (uint *)((ulong)(lightVertices->field_2).ei.field_0 & 0xffffffffffff),
             puVar30 != (uint *)0x0)) {
            bVar34 = *puVar30 < 2;
          }
          else {
            bVar34 = 0;
          }
        }
        else {
          bVar34 = *(byte *)(pFVar29 + -0x59);
        }
        uVar4 = *(ulong *)pFVar29;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar4;
        uVar31 = vcmpps_avx512vl(auVar50,ZEXT816(0) << 0x40,4);
        auVar39._16_48_ = auVar41._16_48_;
        auVar35 = vblendmps_avx512vl(auVar48,auVar50);
        bVar17 = (bool)((byte)uVar31 & 1);
        auVar37._0_4_ = (float)((uint)bVar17 * auVar35._0_4_ | (uint)!bVar17 * (int)uVar4);
        bVar17 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar17 * auVar35._4_4_ | (uint)!bVar17 * (int)(uVar4 >> 0x20);
        auVar37._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar35._8_4_;
        auVar37._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar35._12_4_;
        auVar35 = vmovshdup_avx(auVar37);
        fVar46 = fVar46 * (auVar35._0_4_ / auVar37._0_4_);
        auVar41._0_4_ = auVar42._0_4_ + fVar46;
        auVar39._0_16_ = ZEXT416((uint)auVar41._0_4_);
        auVar41._4_60_ = auVar39._4_60_;
        auVar41._0_4_ =
             (float)((uint)((bVar34 | *(bool *)(pFVar29 + -1)) & 1) * (int)auVar42._0_4_ +
                    (uint)!(bool)((bVar34 | *(bool *)(pFVar29 + -1)) & 1) * (int)auVar41._0_4_);
        lVar32 = lVar32 + -1;
        pFVar29 = pFVar29 + -0x58;
        auVar42 = ZEXT1664(auVar41._0_16_);
      } while (1 < lVar32);
    }
    if (pFVar28 != (Float *)0x0) {
      *pFVar28 = FVar43;
    }
    if (local_388 != (Float *)0x0) {
      *local_388 = local_324;
    }
    if (local_380 != (Float *)0x0) {
      *local_380 = local_320;
    }
    if (local_2d8 != (Float *)0x0) {
      *local_2d8 = local_31c;
    }
    if (local_368 != (bool *)0x0) {
      *local_368 = local_396;
    }
    if (pbVar33 != (bool *)0x0) {
      *pbVar33 = local_395;
    }
    if (local_378 != (Vertex *)0x0) {
      memcpy(local_378,local_148,0x118);
      (local_378->bsdf).bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
      .bits = local_340;
      (local_378->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(undefined4)local_288;
      (local_378->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_288._4_4_
      ;
      *(undefined8 *)&(local_378->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z =
           uStack_280;
      (local_378->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(undefined4)uStack_278;
      (local_378->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z =
           (float)uStack_278._4_4_;
      (local_378->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(undefined4)uStack_270;
      (local_378->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)uStack_270._4_4_;
      (local_378->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = local_38c;
      (local_378->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_338;
      (local_378->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)(CONCAT35(uStack_333,local_338) >> 0x20);
      *(ulong *)((long)&(local_378->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) =
           CONCAT53(uStack_330,uStack_333);
      local_378->field_0x153 = local_38e;
      *(undefined2 *)&local_378->field_0x151 = local_390;
      uVar45 = vmovlps_avx(local_2f8);
      local_378->pdfFwd = (Float)(int)uVar45;
      local_378->pdfRev = (Float)(int)((ulong)uVar45 >> 0x20);
      *(undefined4 *)&local_378->field_0x15c = local_354;
    }
    auVar41._0_4_ = 1.0 / (auVar41._0_4_ + 1.0);
  }
  return auVar41._0_4_;
}

Assistant:

Float MISWeight(const Integrator &integrator, Vertex *lightVertices,
                Vertex *cameraVertices, Vertex &sampled, int s, int t,
                LightSamplerHandle lightSampler) {
    if (s + t == 2)
        return 1;
    Float sumRi = 0;
    // Define helper function _remap0_ that deals with Dirac delta functions
    auto remap0 = [](float f) -> Float { return f != 0 ? f : 1; };

    // Temporarily update vertex properties for current strategy
    // Look up connection vertices and their predecessors
    Vertex *qs = s > 0 ? &lightVertices[s - 1] : nullptr,
           *pt = t > 0 ? &cameraVertices[t - 1] : nullptr,
           *qsMinus = s > 1 ? &lightVertices[s - 2] : nullptr,
           *ptMinus = t > 1 ? &cameraVertices[t - 2] : nullptr;

    // Update sampled vertex for $s=1$ or $t=1$ strategy
    ScopedAssignment<Vertex> a1;
    if (s == 1)
        a1 = {qs, sampled};
    else if (t == 1)
        a1 = {pt, sampled};

    // Mark connection vertices as non-degenerate
    ScopedAssignment<bool> a2, a3;
    if (pt)
        a2 = {&pt->delta, false};
    if (qs)
        a3 = {&qs->delta, false};

    // Update reverse density of vertex $\pt{}_{t-1}$
    ScopedAssignment<Float> a4;
    if (pt)
        a4 = {&pt->pdfRev, s > 0 ? qs->PDF(integrator, qsMinus, *pt)
                                 : pt->PdfLightOrigin(integrator.infiniteLights, *ptMinus,
                                                      lightSampler)};

    // Update reverse density of vertex $\pt{}_{t-2}$
    ScopedAssignment<Float> a5;
    if (ptMinus)
        a5 = {&ptMinus->pdfRev, s > 0 ? pt->PDF(integrator, qs, *ptMinus)
                                      : pt->PdfLight(integrator, *ptMinus)};

    // Update reverse density of vertices $\pq{}_{s-1}$ and $\pq{}_{s-2}$
    ScopedAssignment<Float> a6;
    if (qs)
        a6 = {&qs->pdfRev, pt->PDF(integrator, ptMinus, *qs)};
    ScopedAssignment<Float> a7;
    if (qsMinus)
        a7 = {&qsMinus->pdfRev, qs->PDF(integrator, pt, *qsMinus)};

    // Consider hypothetical connection strategies along the camera subpath
    Float ri = 1;
    for (int i = t - 1; i > 0; --i) {
        ri *= remap0(cameraVertices[i].pdfRev) / remap0(cameraVertices[i].pdfFwd);
        if (!cameraVertices[i].delta && !cameraVertices[i - 1].delta)
            sumRi += ri;
    }

    // Consider hypothetical connection strategies along the light subpath
    ri = 1;
    for (int i = s - 1; i >= 0; --i) {
        ri *= remap0(lightVertices[i].pdfRev) / remap0(lightVertices[i].pdfFwd);
        bool deltaLightvertex =
            i > 0 ? lightVertices[i - 1].delta : lightVertices[0].IsDeltaLight();
        if (!lightVertices[i].delta && !deltaLightvertex)
            sumRi += ri;
    }

    return 1 / (1 + sumRi);
}